

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP3Serializer.cpp
# Opt level: O1

vector<unsigned_long,_std::allocator<unsigned_long>_> * __thiscall
adios2::format::BP3Serializer::AggregateCollectiveMetadataIndices
          (vector<unsigned_long,_std::allocator<unsigned_long>_> *__return_storage_ptr__,
          BP3Serializer *this,Comm *comm,BufferSTL *bufferSTL)

{
  undefined1 *puVar1;
  size_type __n;
  _func_int *p_Var2;
  void *pvVar3;
  unsigned_long uVar4;
  unsigned_long uVar5;
  unsigned_long uVar6;
  long lVar7;
  pointer puVar8;
  BufferSTL *pBVar9;
  int iVar10;
  int iVar11;
  value_type_conflict9 *__val;
  size_t *psVar12;
  size_t sVar13;
  size_t sVar14;
  int *piVar15;
  undefined8 uVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  char *indices;
  BP3Serializer *pBVar20;
  vector<char,_std::allocator<char>_> *out;
  __hashtable *__this;
  size_t sVar21;
  double dVar22;
  ScopedTimer __var2365;
  int size;
  anon_class_8_1_8991fb9c lf_SerializeIndices;
  ScopedTimer __var2357;
  ScopedTimer __var2565;
  anon_class_24_3_e2114302 lf_SortMergeIndices;
  anon_class_16_2_3fe5c9bc lf_DeserializeIndices;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_1a8;
  int local_184;
  size_t *local_180;
  BP3Serializer *local_178;
  vector<char,_std::allocator<char>_> *local_170;
  BufferSTL *local_168;
  Comm *local_160;
  ScopedTimer local_158 [4];
  anon_class_8_1_8991fb9c local_138;
  ScopedTimer local_130;
  size_t local_128;
  size_t local_120;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>_>_>
  *local_118;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>_>_>
  *local_110;
  vector<char,_std::allocator<char>_> *local_108;
  long local_100;
  size_t local_f8;
  ScopedTimer local_f0 [4];
  anon_class_24_3_e2114302 local_d0 [2];
  anon_class_16_2_3fe5c9bc local_98;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_88 [3];
  
  indices = (char *)this;
  local_168 = bufferSTL;
  if ((AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)::
       __var357 == '\0') &&
     (iVar10 = __cxa_guard_acquire(&AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)
                                    ::__var357), iVar10 != 0)) {
    indices = 
    "std::vector<size_t> adios2::format::BP3Serializer::AggregateCollectiveMetadataIndices(const helper::Comm &, BufferSTL &)"
    ;
    uVar16 = ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/format/bp/bp3/BP3Serializer.cpp"
                                 ,
                                 "std::vector<size_t> adios2::format::BP3Serializer::AggregateCollectiveMetadataIndices(const helper::Comm &, BufferSTL &)"
                                 ,0x165);
    AggregateCollectiveMetadataIndices::__var357 = (void *)ps_timer_create_(uVar16);
    __cxa_guard_release(&AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)
                         ::__var357);
  }
  local_130.m_timer = AggregateCollectiveMetadataIndices::__var357;
  if (_perfstubs_initialized == 1) {
    ps_timer_start_();
  }
  iVar10 = helper::Comm::Rank(comm);
  local_184 = helper::Comm::Size(comm);
  if (iVar10 == 0) {
    if ((AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)
         ::__var365 == '\0') &&
       (iVar11 = __cxa_guard_acquire(&AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)
                                      ::__var365), iVar11 != 0)) {
      uVar16 = ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/format/bp/bp3/BP3Serializer.cpp"
                                   ,
                                   "std::vector<size_t> adios2::format::BP3Serializer::AggregateCollectiveMetadataIndices(const helper::Comm &, BufferSTL &)"
                                   ,0x16d);
      AggregateCollectiveMetadataIndices::__var365 = (void *)ps_timer_create_(uVar16);
      __cxa_guard_release(&AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)
                           ::__var365);
    }
    local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)AggregateCollectiveMetadataIndices::__var365;
    if (_perfstubs_initialized == 1) {
      ps_timer_start_();
    }
    puVar1 = &(this->super_BP3Base).field_0x50;
    p_Var2 = (this->super_BP3Base)._vptr_BP3Base[-3];
    std::vector<char,_std::allocator<char>_>::reserve
              ((vector<char,_std::allocator<char>_> *)puVar1,
               (long)local_184 *
               (*(long *)(&(this->super_BP3Base).field_0xf0 + (long)p_Var2) -
               *(long *)(&(this->super_BP3Base).field_0xe8 + (long)p_Var2)));
    std::vector<char,_std::allocator<char>_>::resize
              ((vector<char,_std::allocator<char>_> *)puVar1,0);
    puVar1 = &(this->super_BP3Base).field_0x68;
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::clear((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             *)puVar1);
    uVar16 = *(undefined8 *)
              (&(this->super_BP3Base).field_0x140 + (long)(this->super_BP3Base)._vptr_BP3Base[-3]);
    dVar22 = ceil((((double)CONCAT44(0x45300000,(int)((ulong)uVar16 >> 0x20)) -
                   1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar16) - 4503599627370496.0)) /
                  (double)*(float *)&(this->super_BP3Base).field_0x88);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::rehash((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              *)puVar1,(long)(dVar22 - 9.223372036854776e+18) & (long)dVar22 >> 0x3f | (long)dVar22)
    ;
    puVar1 = &(this->super_BP3Base).field_0xa0;
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::clear((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             *)puVar1);
    uVar16 = *(undefined8 *)
              (&(this->super_BP3Base).field_0x178 + (long)(this->super_BP3Base)._vptr_BP3Base[-3]);
    dVar22 = ceil((((double)CONCAT44(0x45300000,(int)((ulong)uVar16 >> 0x20)) -
                   1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)uVar16) - 4503599627370496.0)) /
                  (double)*(float *)&(this->super_BP3Base).field_0xc0);
    indices = (char *)((long)(dVar22 - 9.223372036854776e+18) & (long)dVar22 >> 0x3f | (long)dVar22)
    ;
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::rehash((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              *)puVar1,(size_type)indices);
    external::perfstubs_profiler::ScopedTimer::~ScopedTimer((ScopedTimer *)&local_1a8);
  }
  pBVar9 = local_168;
  local_98.size = &local_184;
  local_d0[0].bufferSTL = local_168;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_138.this = this;
  local_d0[0].this = this;
  local_d0[0].comm = comm;
  local_98.this = this;
  psVar12 = (size_t *)operator_new(0x18);
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_start = psVar12;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_finish = psVar12;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = psVar12 + 3;
  *psVar12 = 0;
  psVar12[1] = 0;
  psVar12[2] = 0;
  (__return_storage_ptr__->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
  _M_impl.super__Vector_impl_data._M_finish = psVar12 + 3;
  *psVar12 = (pBVar9->super_Buffer).m_AbsolutePosition;
  if ((AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)::
       $_2::operator()(adios2::helper::Comm_const&,int)::__var403 == '\0') &&
     (iVar11 = __cxa_guard_acquire(&AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)
                                    ::$_2::operator()(adios2::helper::Comm_const&,int)::__var403),
     iVar11 != 0)) {
    indices = 
    "auto adios2::format::BP3Serializer::AggregateCollectiveMetadataIndices(const helper::Comm &, BufferSTL &)::(anonymous class)::operator()(const helper::Comm &, const int) const"
    ;
    uVar16 = ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/format/bp/bp3/BP3Serializer.cpp"
                                 ,
                                 "auto adios2::format::BP3Serializer::AggregateCollectiveMetadataIndices(const helper::Comm &, BufferSTL &)::(anonymous class)::operator()(const helper::Comm &, const int) const"
                                 ,0x193);
    AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)::$_2
    ::operator()(adios2::helper::Comm_const&,int)::__var403 = (pointer)ps_timer_create_(uVar16);
    __cxa_guard_release(&AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)
                         ::$_2::operator()(adios2::helper::Comm_const&,int)::__var403);
  }
  local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)::
       $_2::operator()(adios2::helper::Comm_const&,int)::__var403;
  if (_perfstubs_initialized == 1) {
    ps_timer_start_();
  }
  p_Var2 = (this->super_BP3Base)._vptr_BP3Base[-3];
  lVar19 = *(long *)(&(this->super_BP3Base).field_0xf0 + (long)p_Var2) -
           *(long *)(&(this->super_BP3Base).field_0xe8 + (long)p_Var2);
  sVar13 = AggregateCollectiveMetadataIndices::anon_class_1_0_00000001::operator()
                     ((anon_class_1_0_00000001 *)(&(this->super_BP3Base).field_0x128 + (long)p_Var2)
                      ,(unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BPBase::SerialElementIndex,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BPBase::SerialElementIndex>_>_>
                        *)indices);
  local_160 = comm;
  sVar14 = AggregateCollectiveMetadataIndices::anon_class_1_0_00000001::operator()
                     ((anon_class_1_0_00000001 *)
                      (&(this->super_BP3Base).field_0x160 +
                      (long)(this->super_BP3Base)._vptr_BP3Base[-3]),
                      (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BPBase::SerialElementIndex,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BPBase::SerialElementIndex>_>_>
                       *)indices);
  puVar1 = &(this->super_BP3Base).field_0x20;
  __n = sVar14 + 0x24 + sVar13 + lVar19;
  local_178 = this;
  std::vector<char,_std::allocator<char>_>::reserve
            ((vector<char,_std::allocator<char>_> *)puVar1,__n);
  std::vector<char,_std::allocator<char>_>::resize
            ((vector<char,_std::allocator<char>_> *)puVar1,__n);
  pBVar20 = local_178;
  **(int **)&(local_178->super_BP3Base).field_0x20 = iVar10;
  *(size_t *)(*(long *)&(local_178->super_BP3Base).field_0x20 + 4) = sVar14 + sVar13 + lVar19 + 0x20
  ;
  *(long *)(*(long *)&(local_178->super_BP3Base).field_0x20 + 0xc) = lVar19 + 0x24;
  *(size_t *)(*(long *)&(local_178->super_BP3Base).field_0x20 + 0x14) = sVar13 + lVar19 + 0x24;
  *(undefined8 *)(*(long *)&(local_178->super_BP3Base).field_0x20 + 0x1c) =
       *(undefined8 *)
        (&(local_178->super_BP3Base).field_0x1a0 +
        (long)(local_178->super_BP3Base)._vptr_BP3Base[-3]);
  local_158[0].m_timer = (void *)0x24;
  p_Var2 = (local_178->super_BP3Base)._vptr_BP3Base[-3];
  pvVar3 = *(void **)(&(local_178->super_BP3Base).field_0xe8 + (long)p_Var2);
  sVar21 = *(long *)(&(local_178->super_BP3Base).field_0xf0 + (long)p_Var2) - (long)pvVar3;
  if (sVar21 != 0) {
    memmove((void *)(*(long *)puVar1 + 0x24),pvVar3,sVar21);
  }
  local_158[0].m_timer = (void *)(sVar21 + 0x24);
  AggregateCollectiveMetadataIndices::anon_class_8_1_8991fb9c::operator()
            (&local_138,
             (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BPBase::SerialElementIndex,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BPBase::SerialElementIndex>_>_>
              *)(&(pBVar20->super_BP3Base).field_0x128 +
                (long)(pBVar20->super_BP3Base)._vptr_BP3Base[-3]),(size_t *)local_158);
  pBVar9 = local_168;
  AggregateCollectiveMetadataIndices::anon_class_8_1_8991fb9c::operator()
            (&local_138,
             (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BPBase::SerialElementIndex,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_adios2::format::BPBase::SerialElementIndex>_>_>
              *)(&(pBVar20->super_BP3Base).field_0x160 +
                (long)(pBVar20->super_BP3Base)._vptr_BP3Base[-3]),(size_t *)local_158);
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer((ScopedTimer *)&local_1a8);
  psVar12 = &(pBVar9->super_Buffer).m_Position;
  local_128 = (pBVar9->super_Buffer).m_Position;
  out = &pBVar9->m_Buffer;
  helper::Comm::GathervVectors<char>
            (local_160,(vector<char,_std::allocator<char>_> *)puVar1,out,psVar12,0);
  uVar18 = (ulong)(*(int *)(&(pBVar20->super_BP3Base).field_0x198 +
                           (long)(pBVar20->super_BP3Base)._vptr_BP3Base[-3]) + 0x28);
  local_180 = psVar12;
  local_170 = out;
  std::vector<char,_std::allocator<char>_>::reserve(out,*psVar12 + uVar18);
  std::vector<char,_std::allocator<char>_>::resize(out,*psVar12 + uVar18);
  if (iVar10 == 0) {
    if ((AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)
         ::__var565 == '\0') &&
       (iVar10 = __cxa_guard_acquire(&AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)
                                      ::__var565), iVar10 != 0)) {
      uVar16 = ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/format/bp/bp3/BP3Serializer.cpp"
                                   ,
                                   "std::vector<size_t> adios2::format::BP3Serializer::AggregateCollectiveMetadataIndices(const helper::Comm &, BufferSTL &)"
                                   ,0x235);
      AggregateCollectiveMetadataIndices::__var565 = (void *)ps_timer_create_(uVar16);
      __cxa_guard_release(&AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)
                           ::__var565);
      pBVar20 = local_178;
      out = local_170;
    }
    psVar12 = local_180;
    local_f0[0].m_timer = AggregateCollectiveMetadataIndices::__var565;
    if (_perfstubs_initialized == 1) {
      ps_timer_start_();
    }
    sVar13 = *psVar12;
    local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)operator_new(0x20);
    local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start + 4;
    local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[2] = 0;
    local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[3] = 0;
    *local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
     super__Vector_impl_data._M_start = 0;
    local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[1] = 0;
    local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_finish;
    helper::IsLittleEndian();
    if (sVar13 == 0) {
      lVar19 = 0;
    }
    else {
      local_108 = (vector<char,_std::allocator<char>_> *)&(pBVar20->super_BP3Base).field_0x50;
      local_110 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>_>_>
                   *)&(pBVar20->super_BP3Base).field_0x68;
      local_118 = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>_>_>
                   *)&(pBVar20->super_BP3Base).field_0xa0;
      uVar18 = 0;
      lVar19 = 0;
      local_120 = sVar13;
      do {
        piVar15 = (int *)((out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                          super__Vector_impl_data._M_start + uVar18);
        iVar10 = *piVar15;
        local_160 = (Comm *)(uVar18 + 4);
        lVar17 = 0;
        do {
          local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start[lVar17] = *(unsigned_long *)(piVar15 + lVar17 * 2 + 1);
          lVar17 = lVar17 + 1;
        } while (lVar17 != 4);
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(local_88,&local_1a8);
        if ((AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)
             ::$_4::
             operator()(int,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<char,std::allocator<char>>const&,unsigned_long)
             ::__var487 == '\0') &&
           (iVar11 = __cxa_guard_acquire(&AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)
                                          ::$_4::
                                          operator()(int,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<char,std::allocator<char>>const&,unsigned_long)
                                          ::__var487), iVar11 != 0)) {
          uVar16 = ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/format/bp/bp3/BP3Serializer.cpp"
                                       ,
                                       "auto adios2::format::BP3Serializer::AggregateCollectiveMetadataIndices(const helper::Comm &, BufferSTL &)::(anonymous class)::operator()(const int, const std::vector<size_t>, const std::vector<char> &, const size_t) const"
                                       ,0x1e7);
          AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)
          ::$_4::
          operator()(int,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<char,std::allocator<char>>const&,unsigned_long)
          ::__var487 = (void *)ps_timer_create_(uVar16);
          __cxa_guard_release(&AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)
                               ::$_4::
                               operator()(int,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<char,std::allocator<char>>const&,unsigned_long)
                               ::__var487);
        }
        local_158[0].m_timer =
             AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)
             ::$_4::
             operator()(int,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<char,std::allocator<char>>const&,unsigned_long)
             ::__var487;
        if (_perfstubs_initialized == 1) {
          ps_timer_start_();
        }
        uVar4 = *local_88[0].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar5 = local_88[0].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start[1];
        uVar6 = local_88[0].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                _M_impl.super__Vector_impl_data._M_start[2];
        local_100 = lVar19 + local_88[0].
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start[3];
        iVar11 = pthread_mutex_lock((pthread_mutex_t *)BPSerializer::m_Mutex);
        out = local_170;
        if (iVar11 != 0) {
          std::__throw_system_error(iVar11);
        }
        local_f8 = uVar18 + uVar5;
        helper::InsertToBuffer<char>
                  (local_108,
                   (local_170->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                   super__Vector_impl_data._M_start + uVar18 + 0x24,uVar5 - 0x24);
        pthread_mutex_unlock((pthread_mutex_t *)BPSerializer::m_Mutex);
        AggregateCollectiveMetadataIndices::anon_class_16_2_3fe5c9bc::operator()
                  (&local_98,local_110,iVar10,out,local_f8,uVar6 + uVar18,false);
        AggregateCollectiveMetadataIndices::anon_class_16_2_3fe5c9bc::operator()
                  (&local_98,local_118,iVar10,out,uVar6 + uVar18,
                   (long)&(local_160->m_Impl)._M_t.
                          super___uniq_ptr_impl<adios2::helper::CommImpl,_std::default_delete<adios2::helper::CommImpl>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_adios2::helper::CommImpl_*,_std::default_delete<adios2::helper::CommImpl>_>
                          .super__Head_base<0UL,_adios2::helper::CommImpl_*,_false>._M_head_impl +
                   uVar4,true);
        external::perfstubs_profiler::ScopedTimer::~ScopedTimer(local_158);
        sVar13 = local_120;
        if (local_88[0].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_88[0].
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        uVar18 = uVar18 + *local_1a8.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start + 4;
        lVar19 = local_100;
      } while (uVar18 < sVar13);
    }
    if (local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    external::perfstubs_profiler::ScopedTimer::~ScopedTimer(local_f0);
    psVar12 = local_180;
    if ((AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)
         ::__var596 == '\0') &&
       (iVar10 = __cxa_guard_acquire(&AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)
                                      ::__var596), iVar10 != 0)) {
      uVar16 = ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/format/bp/bp3/BP3Serializer.cpp"
                                   ,
                                   "std::vector<size_t> adios2::format::BP3Serializer::AggregateCollectiveMetadataIndices(const helper::Comm &, BufferSTL &)"
                                   ,0x254);
      AggregateCollectiveMetadataIndices::__var596 = (void *)ps_timer_create_(uVar16);
      __cxa_guard_release(&AggregateCollectiveMetadataIndices(adios2::helper::Comm_const&,adios2::format::BufferSTL&)
                           ::__var596);
      psVar12 = local_180;
      out = local_170;
    }
    local_1a8.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)AggregateCollectiveMetadataIndices::__var596;
    if (_perfstubs_initialized == 1) {
      ps_timer_start_();
    }
    pBVar20 = local_178;
    *psVar12 = local_128;
    lVar17 = *(long *)&(local_178->super_BP3Base).field_0x58;
    lVar7 = *(long *)&(local_178->super_BP3Base).field_0x50;
    *(long *)((out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
              ._M_start + local_128) = lVar19;
    sVar13 = *psVar12;
    *psVar12 = sVar13 + 8;
    *(long *)((out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
              ._M_start + sVar13 + 8) = lVar17 - lVar7;
    sVar13 = *psVar12;
    *psVar12 = sVar13 + 8;
    pvVar3 = *(void **)&(local_178->super_BP3Base).field_0x50;
    sVar21 = *(long *)&(local_178->super_BP3Base).field_0x58 - (long)pvVar3;
    if (sVar21 != 0) {
      memmove((out->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
              ._M_start + sVar13 + 8,pvVar3,sVar21);
    }
    pBVar9 = local_168;
    sVar13 = sVar21 + (local_168->super_Buffer).m_Position;
    (local_168->super_Buffer).m_Position = sVar13;
    puVar8 = (__return_storage_ptr__->
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar8[1] = sVar13 + (local_168->super_Buffer).m_AbsolutePosition;
    AggregateCollectiveMetadataIndices::anon_class_24_3_e2114302::operator()
              (local_d0,(unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>_>_>
                         *)&(pBVar20->super_BP3Base).field_0x68);
    puVar8[2] = (pBVar9->super_Buffer).m_Position + (pBVar9->super_Buffer).m_AbsolutePosition;
    AggregateCollectiveMetadataIndices::anon_class_24_3_e2114302::operator()
              (local_d0,(unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<adios2::format::BPBase::SerialElementIndex,_std::allocator<adios2::format::BPBase::SerialElementIndex>_>_>_>_>
                         *)&(pBVar20->super_BP3Base).field_0xa0);
    external::perfstubs_profiler::ScopedTimer::~ScopedTimer((ScopedTimer *)&local_1a8);
  }
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&local_130);
  return __return_storage_ptr__;
}

Assistant:

std::vector<size_t> BP3Serializer::AggregateCollectiveMetadataIndices(helper::Comm const &comm,
                                                                      BufferSTL &bufferSTL)
{
    PERFSTUBS_SCOPED_TIMER_FUNC();
    int rank = comm.Rank();
    int size = comm.Size();

    // pre-allocate with rank 0 data
    size_t pgCount = 0; //< tracks global PG count
    if (rank == 0)
    {
        PERFSTUBS_SCOPED_TIMER_FUNC();
        // assumes that things are more or less balanced
        m_PGRankIndices.reserve(m_MetadataSet.PGIndex.Buffer.size() * static_cast<size_t>(size));
        m_PGRankIndices.resize(0);

        m_VariableRankIndices.clear();
        m_VariableRankIndices.reserve(m_MetadataSet.VarsIndices.size());

        m_AttributesRankIndices.clear();
        m_AttributesRankIndices.reserve(m_MetadataSet.AttributesIndices.size());
    }

    auto lf_IndicesSize =
        [&](const std::unordered_map<std::string, SerialElementIndex> &indices) -> size_t

    {
        PERFSTUBS_SCOPED_TIMER_FUNC();
        size_t indicesSize = 0;
        for (const auto &indexPair : indices)
        {
            indicesSize += indexPair.second.Buffer.size();
        }
        return indicesSize;
    };

    auto lf_SerializeIndices =
        [&](const std::unordered_map<std::string, SerialElementIndex> &indices, size_t &position)

    {
        PERFSTUBS_SCOPED_TIMER_FUNC();
        for (const auto &indexPair : indices)
        {
            const auto &buffer = indexPair.second.Buffer;
            helper::CopyToBuffer(m_SerializedIndices, position, buffer.data(), buffer.size());
        }
    };

    auto lf_SerializeAllIndices = [&](helper::Comm const &comm, const int rank) {
        PERFSTUBS_SCOPED_TIMER_FUNC();
        const size_t pgIndicesSize = m_MetadataSet.PGIndex.Buffer.size();
        const size_t variablesIndicesSize = lf_IndicesSize(m_MetadataSet.VarsIndices);
        const size_t attributesIndicesSize = lf_IndicesSize(m_MetadataSet.AttributesIndices);

        // first pre-allocate
        const size_t serializedIndicesSize =
            8 * 4 + pgIndicesSize + variablesIndicesSize + attributesIndicesSize;

        m_SerializedIndices.reserve(serializedIndicesSize + 4);
        m_SerializedIndices.resize(serializedIndicesSize + 4);

        const uint32_t rank32 = static_cast<uint32_t>(rank);
        const uint64_t size64 = static_cast<uint64_t>(serializedIndicesSize);
        const uint64_t variablesIndexOffset = static_cast<uint64_t>(pgIndicesSize + 36);
        const uint64_t attributesIndexOffset =
            static_cast<uint64_t>(pgIndicesSize + 36 + variablesIndicesSize);

        size_t position = 0;
        helper::CopyToBuffer(m_SerializedIndices, position, &rank32);
        helper::CopyToBuffer(m_SerializedIndices, position, &size64);
        helper::CopyToBuffer(m_SerializedIndices, position, &variablesIndexOffset);
        helper::CopyToBuffer(m_SerializedIndices, position, &attributesIndexOffset);
        helper::CopyToBuffer(m_SerializedIndices, position, &m_MetadataSet.DataPGCount);

        helper::CopyToBuffer(m_SerializedIndices, position, m_MetadataSet.PGIndex.Buffer.data(),
                             m_MetadataSet.PGIndex.Buffer.size());
        lf_SerializeIndices(m_MetadataSet.VarsIndices, position);
        lf_SerializeIndices(m_MetadataSet.AttributesIndices, position);
    };

    auto lf_DeserializeIndices =
        [&](std::unordered_map<std::string, std::vector<SerialElementIndex>> &deserialized,
            const int rankSource, const std::vector<char> &serialized, const size_t position,
            const size_t endPosition, const bool isRankConstant)

    {
        PERFSTUBS_SCOPED_TIMER_FUNC();
        size_t localPosition = position;
        while (localPosition < endPosition)
        {
            size_t indexPosition = localPosition;
            const ElementIndexHeader header =
                ReadElementIndexHeader(serialized, indexPosition, helper::IsLittleEndian());
            const size_t bufferSize = static_cast<size_t>(header.Length) + 4;

            if (isRankConstant && deserialized.count(header.Name) == 1)
            {
                localPosition += bufferSize;
                continue;
            }
            std::vector<BP3Base::SerialElementIndex> *deserializedIndexes = nullptr;
            auto search = deserialized.find(header.Name);
            if (search == deserialized.end())
            {
                // key (variable name) is not in the map, add it
                // mutex portion
                {
                    std::lock_guard<std::mutex> lock(m_Mutex);
                    deserializedIndexes =
                        &(deserialized
                              .emplace(std::piecewise_construct, std::forward_as_tuple(header.Name),
                                       std::forward_as_tuple(
                                           size, SerialElementIndex(header.MemberID, bufferSize)))
                              .first->second);
                }
            }
            else
            {
                // variable name is already in the map, just get the pointer
                // of the vector of metadata indices
                deserializedIndexes = &(search->second);
            }

            SerialElementIndex &index = deserializedIndexes->at(static_cast<size_t>(rankSource));
            helper::InsertToBuffer(index.Buffer, &serialized[localPosition], bufferSize);
            localPosition += bufferSize;
        }
    };

    auto lf_DeserializeAllIndices = [&](const int rankSource, const std::vector<size_t> headerInfo,
                                        const std::vector<char> &serialized, const size_t position)

    {
        PERFSTUBS_SCOPED_TIMER_FUNC();
        const size_t rankIndicesSize = headerInfo[0];
        const size_t variablesIndexOffset = headerInfo[1] + position;
        const size_t attributesIndexOffset = headerInfo[2] + position;
        pgCount += headerInfo[3];
        size_t localPosition = position + 36;

        const size_t pgIndexLength = variablesIndexOffset - localPosition;
        // first deserialize pg indices
        {
            std::lock_guard<std::mutex> lock(m_Mutex);
            helper::InsertToBuffer(m_PGRankIndices, &serialized[localPosition], pgIndexLength);
        }
        // deserialize variable indices
        localPosition = variablesIndexOffset;
        size_t endPosition = attributesIndexOffset;

        lf_DeserializeIndices(m_VariableRankIndices, rankSource, serialized, localPosition,
                              endPosition, false);

        // deserialize attributes indices
        localPosition = attributesIndexOffset;
        endPosition = rankIndicesSize + 4 + position;
        // attributes are constant and unique across ranks
        lf_DeserializeIndices(m_AttributesRankIndices, rankSource, serialized, localPosition,
                              endPosition, true);
    };

    auto lf_SortMergeIndices =
        [&](const std::unordered_map<std::string, std::vector<SerialElementIndex>>
                &deserializedIndices) {
            PERFSTUBS_SCOPED_TIMER_FUNC();
            auto &position = bufferSTL.m_Position;
            auto &buffer = bufferSTL.m_Buffer;

            size_t countPosition = position;

            const uint32_t totalCountU32 = static_cast<uint32_t>(deserializedIndices.size());
            helper::CopyToBuffer(buffer, countPosition, &totalCountU32);
            position += 12; // skip for length

            MergeSerializeIndices(deserializedIndices, comm, bufferSTL);

            // Write length
            const uint64_t totalLengthU64 = static_cast<uint64_t>(position - countPosition - 8);
            helper::CopyToBuffer(buffer, countPosition, &totalLengthU64);
        };

    // BODY of function starts here
    std::vector<size_t> indexPositions(3);
    // pgIndex
    indexPositions[0] = bufferSTL.m_AbsolutePosition;

    lf_SerializeAllIndices(comm, rank); // Set m_SerializedIndices

    size_t countPosition = bufferSTL.m_Position;

    comm.GathervVectors(m_SerializedIndices, bufferSTL.m_Buffer, bufferSTL.m_Position, 0);

    // use bufferSTL (will resize) to GatherV
    const size_t extraSize = 16 + 12 + 12 + m_MetadataSet.MiniFooterSize;

    try
    {
        bufferSTL.m_Buffer.reserve(bufferSTL.m_Position + extraSize); // to avoid power of 2 growth
        bufferSTL.m_Buffer.resize(bufferSTL.m_Position + extraSize);
    }
    catch (...)
    {
        helper::ThrowNested<std::runtime_error>(
            "Toolkit::Format", "bp::bp3::BP3Serializer", "AggregateCollectiveMetadataIndices",
            "buffer overflow when resizing to " + std::to_string(bufferSTL.m_Position + extraSize) +
                " bytes");
    }

    // deserialize, it's all local inside rank 0
    if (rank == 0)
    {
        PERFSTUBS_SCOPED_TIMER_FUNC();
        const size_t serializedSize = bufferSTL.m_Position;
        const std::vector<char> &serialized = bufferSTL.m_Buffer;
        size_t serializedPosition = 0;
        std::vector<size_t> headerInfo(4);
        const bool isLittleEndian = helper::IsLittleEndian();

        // if (m_Parameters.Threads == 1)
        {
            while (serializedPosition < serializedSize)
            {
                size_t localPosition = serializedPosition;

                const int rankSource = static_cast<int>(
                    helper::ReadValue<uint32_t>(serialized, localPosition, isLittleEndian));

                for (auto i = 0; i < 4; ++i)
                {
                    headerInfo[i] = static_cast<size_t>(
                        helper::ReadValue<uint64_t>(serialized, localPosition, isLittleEndian));
                }

                lf_DeserializeAllIndices(rankSource, headerInfo, serialized, serializedPosition);
                serializedPosition += headerInfo[0] + 4;
            }
        }
    }

    // now merge (and sort variables and attributes) indices
    if (rank == 0)
    {
        PERFSTUBS_SCOPED_TIMER_FUNC();
        auto &position = bufferSTL.m_Position;
        auto &buffer = bufferSTL.m_Buffer;
        position = countPosition; // back to pg count position

        const uint64_t pgCount64 = static_cast<uint64_t>(pgCount);
        const uint64_t pgLength64 = static_cast<uint64_t>(m_PGRankIndices.size());

        helper::CopyToBuffer(buffer, position, &pgCount64);
        helper::CopyToBuffer(buffer, position, &pgLength64);
        helper::CopyToBuffer(buffer, position, m_PGRankIndices.data(), m_PGRankIndices.size());

        indexPositions[1] = bufferSTL.m_AbsolutePosition + position;
        lf_SortMergeIndices(m_VariableRankIndices);
        indexPositions[2] = bufferSTL.m_AbsolutePosition + position;
        lf_SortMergeIndices(m_AttributesRankIndices);
    }

    return indexPositions;
}